

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-moments.cc
# Opt level: O0

void __thiscall
dynet::StdElements::forward_dev_impl<dynet::Device_CPU>
          (StdElements *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  uint uVar1;
  const_reference ppTVar2;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  double __x;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar3;
  float n;
  array<ptrdiff_t,_2> newaxis;
  array<ptrdiff_t,_2> bcast;
  array<ptrdiff_t,_1> red_axis;
  DefaultDevice *in_stack_fffffffffffffbc8;
  Tensor *this_00;
  undefined1 in_stack_fffffffffffffbd8 [16];
  array<long,_1UL> *dims;
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<long,_2UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReshapingOp<const_std::array<long,_2UL>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>_>_>_>,_0>
  *this_01;
  undefined1 in_stack_fffffffffffffbe8 [16];
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
  *in_stack_fffffffffffffbf8;
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<long,_2UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReshapingOp<const_std::array<long,_2UL>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>_>_>_>_>,_Eigen::MakePointer>_>,_0>
  local_e8 [156];
  float local_4c;
  undefined8 local_48;
  ulong local_40;
  ulong local_38;
  undefined8 local_30;
  undefined8 local_28;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *local_18;
  Scalar rhs;
  
  local_28 = 0;
  this_00 = (Tensor *)0x0;
  local_18 = in_RDX;
  ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (in_RDX,0);
  uVar1 = Dim::batch_size(&(*ppTVar2)->d);
  local_38 = (ulong)uVar1;
  local_30 = 1;
  local_48 = 1;
  ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (local_18,(size_type)this_00);
  local_40 = (ulong)((*ppTVar2)->d).bd;
  ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (local_18,(size_type)this_00);
  uVar1 = Dim::batch_size(&(*ppTVar2)->d);
  local_4c = (float)uVar1;
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](local_18,0)
  ;
  Tensor::tbvec(in_stack_fffffffffffffbe8._8_8_);
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](local_18,0)
  ;
  Tensor::tbvec(in_stack_fffffffffffffbe8._8_8_);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
  sum<std::array<long,1ul>>(in_stack_fffffffffffffbd8._8_8_,in_stack_fffffffffffffbd8._0_8_);
  Eigen::
  TensorBase<Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,std::array<long,1ul>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const,Eigen::MakePointer>,0>
  ::reshape<std::array<long,2ul>>(in_stack_fffffffffffffbd8._8_8_,in_stack_fffffffffffffbd8._0_8_);
  Eigen::
  TensorBase<Eigen::TensorReshapingOp<const_std::array<long,_2UL>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>,_0>
  ::operator/(in_stack_fffffffffffffbe8._0_8_,in_stack_fffffffffffffbd8._12_4_);
  Eigen::
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,float>>,Eigen::TensorReshapingOp<std::array<long,2ul>const,Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,std::array<long,1ul>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const,Eigen::MakePointer>const>const>,0>
  ::broadcast<std::array<long,2ul>>(in_stack_fffffffffffffbd8._0_8_,(array<long,_2UL> *)this_00);
  this_01 = in_stack_fffffffffffffbe8._0_8_;
  dims = in_stack_fffffffffffffbd8._12_8_;
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
  operator-(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbe8._8_8_);
  Eigen::
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<long,_2UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReshapingOp<const_std::array<long,_2UL>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>_>_>_>,_0>
  ::square(this_01);
  rhs = (Scalar)((ulong)dims >> 0x20);
  Eigen::
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const,Eigen::TensorBroadcastingOp<std::array<long,2ul>const,Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,float>>,Eigen::TensorReshapingOp<std::array<long,2ul>const,Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,std::array<long,1ul>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const,Eigen::MakePointer>const>const>const>const>const>,0>
  ::sum<std::array<long,1ul>>
            ((TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<long,_2UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReshapingOp<const_std::array<long,_2UL>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>_>_>_>_>,_0>
              *)this_01,dims);
  Eigen::
  TensorBase<Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<long,_2UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReshapingOp<const_std::array<long,_2UL>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>_>_>_>_>,_Eigen::MakePointer>,_0>
  ::operator/((TensorBase<Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<long,_2UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReshapingOp<const_std::array<long,_2UL>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>_>_>_>_>,_Eigen::MakePointer>,_0>
               *)this_01,rhs);
  Eigen::
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<long,_2UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReshapingOp<const_std::array<long,_2UL>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>_>_>_>_>,_Eigen::MakePointer>_>,_0>
  ::sqrt(local_e8,__x);
  TVar3 = Tensor::tb<0>(this_00);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>::
  device<Eigen::DefaultDevice>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)this_00,in_stack_fffffffffffffbc8);
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
               *)TVar3.m_dimensions.super_array<long,_1>._M_elems[0].super_array<long,_1>,
              (TensorCwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_square_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<long,_2UL>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_quotient_op<float,_float>_>,_const_Eigen::TensorReshapingOp<const_std::array<long,_2UL>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>_>_>_>_>,_Eigen::MakePointer>_>_>
               *)TVar3.m_data);
  return;
}

Assistant:

void StdElements::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  DYNET_ASSERT(xs.size() == 1, "Failed dimension check in StdElements::forward");
  Eigen::array<ptrdiff_t, 1> red_axis = {0};
  Eigen::array<ptrdiff_t, 2> bcast = {xs[0]->d.batch_size(), 1};
  Eigen::array<ptrdiff_t, 2> newaxis = {1, xs[0]->d.bd};
  float n = (float) xs[0]->d.batch_size();
  fx.tb<0>().device(*dev.edevice) = ((xs[0]->tbvec() - (xs[0]->tbvec().sum(red_axis).reshape(newaxis) / n).broadcast(bcast)).square().sum(red_axis) / n).sqrt();
}